

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall
Rml::Context::UpdateHoverChain
          (Context *this,Vector2i old_mouse_position,int key_modifier_state,
          Dictionary *out_parameters,Dictionary *out_drag_parameters)

{
  ScrollController *this_00;
  pointer ppEVar1;
  pointer ppVar2;
  Vector2f point;
  pointer ppEVar3;
  pointer ppEVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  type pVVar8;
  ComputedValues *pCVar9;
  SystemInterface *pSVar10;
  Context *pCVar11;
  Element *this_01;
  Element *local_d0;
  Dictionary drag_start_parameters;
  Vector2i old_mouse_position_local;
  String local_98;
  Vector2f local_78;
  undefined8 uStack_70;
  Dictionary local_drag_parameters;
  Dictionary local_parameters;
  
  local_78 = *(Vector2f *)&this->mouse_position;
  uStack_70 = 0;
  local_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_drag_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (out_parameters == (Dictionary *)0x0) {
    out_parameters = &local_parameters;
  }
  local_drag_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_drag_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (out_drag_parameters == (Dictionary *)0x0) {
    out_drag_parameters = &local_drag_parameters;
  }
  pCVar11 = this;
  old_mouse_position_local = old_mouse_position;
  GenerateMouseEventParameters(this,out_parameters,-1);
  GenerateKeyModifierEventParameters(pCVar11,out_parameters,key_modifier_state);
  GenerateMouseEventParameters(this,out_drag_parameters,-1);
  pCVar11 = this;
  GenerateDragEventParameters(this,out_drag_parameters);
  GenerateKeyModifierEventParameters(pCVar11,out_drag_parameters,key_modifier_state);
  this_01 = this->drag;
  if ((this_01 != (Element *)0x0) &&
     (((this->mouse_position).x != old_mouse_position_local.x ||
      ((this->mouse_position).y != old_mouse_position_local.y)))) {
    if (this->drag_started == false) {
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::vector(&drag_start_parameters.m_container,&out_drag_parameters->m_container);
      pVVar8 = itlib::
               flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
               ::operator[]<char_const(&)[8]>
                         ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                           *)&drag_start_parameters,(char (*) [8])"mouse_x");
      Variant::operator=(pVVar8,&old_mouse_position_local.x);
      pVVar8 = itlib::
               flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
               ::operator[]<char_const(&)[8]>
                         ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                           *)&drag_start_parameters,(char (*) [8])"mouse_y");
      Variant::operator=(pVVar8,&old_mouse_position_local.y);
      Element::DispatchEvent(this->drag,Dragstart,&drag_start_parameters);
      this->drag_started = true;
      pCVar9 = Element::GetComputedValues(this->drag);
      if (((undefined1  [80])pCVar9->rare & (undefined1  [80])0x700000) ==
          (undefined1  [80])0x400000) {
        CreateDragClone(this,this->drag);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::~vector(&drag_start_parameters.m_container);
      this_01 = this->drag;
    }
    Element::DispatchEvent(this_01,Drag,out_drag_parameters);
  }
  local_78.x = (float)(int)local_78.x;
  local_78.y = (float)(int)local_78.y;
  uStack_70 = CONCAT44((float)uStack_70._4_4_,(float)(int)uStack_70);
  if (this->mouse_active == true) {
    point.y = local_78.y;
    point.x = local_78.x;
    local_d0 = GetElementAtPoint(this,point,(Element *)0x0,(Element *)0x0);
  }
  else {
    local_d0 = (Element *)0x0;
  }
  this->hover = local_d0;
  if (this->enable_cursor != true) goto LAB_002569c9;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&drag_start_parameters.m_container.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)drag_start_parameters.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  this_00 = (this->scroll_controller)._M_t.
            super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
            ._M_t.
            super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
            .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  if (this_00->mode == Autoscroll) {
    ScrollController::GetAutoscrollCursor_abi_cxx11_
              (&local_98,this_00,this->mouse_position,this->density_independent_pixel_ratio);
LAB_00256966:
    ::std::__cxx11::string::operator=((string *)&drag_start_parameters,(string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    if (this->drag != (Element *)0x0) {
      pCVar9 = Element::GetComputedValues(this->drag);
      Style::ComputedValues::cursor_abi_cxx11_(&local_98,pCVar9);
      goto LAB_00256966;
    }
    if (local_d0 != (Element *)0x0) {
      pCVar9 = Element::GetComputedValues(local_d0);
      Style::ComputedValues::cursor_abi_cxx11_(&local_98,pCVar9);
      goto LAB_00256966;
    }
  }
  bVar7 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &drag_start_parameters,&this->cursor_name);
  if (bVar7) {
    pSVar10 = GetSystemInterface();
    (*pSVar10->_vptr_SystemInterface[6])(pSVar10,&drag_start_parameters);
    ::std::__cxx11::string::_M_assign((string *)&this->cursor_name);
  }
  ::std::__cxx11::string::~string((string *)&drag_start_parameters);
  local_d0 = this->hover;
LAB_002569c9:
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; local_d0 != (Element *)0x0; local_d0 = Element::GetParentNode(local_d0)) {
    itlib::
    flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::insert<Rml::Element*&>
              ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)&drag_start_parameters,&local_d0);
  }
  SendEvents(&this->hover_chain,(ElementSet *)&drag_start_parameters,Mouseout,out_parameters);
  SendEvents((ElementSet *)&drag_start_parameters,&this->hover_chain,Mouseover,out_parameters);
  if ((this->drag != (Element *)0x0) && (this->mouse_active == true)) {
    local_d0 = GetElementAtPoint(this,local_78,this->drag,(Element *)0x0);
    this->drag_hover = local_d0;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    for (; local_d0 != (Element *)0x0; local_d0 = Element::GetParentNode(local_d0)) {
      itlib::
      flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
      ::insert<Rml::Element*&>
                ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                  *)&local_98,&local_d0);
    }
    if ((this->drag_started == true) && (this->drag_verbose == true)) {
      SendEvents(&this->drag_hover_chain,(ElementSet *)&local_98,Dragout,out_drag_parameters);
      SendEvents((ElementSet *)&local_98,&this->drag_hover_chain,Dragover,out_drag_parameters);
    }
    ppEVar1 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
    ppEVar3 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar4 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
    local_98._M_dataplus._M_p = (pointer)ppEVar3;
    local_98._M_string_length = (size_type)ppEVar4;
    local_98.field_2._M_allocated_capacity = (size_type)ppEVar1;
    ::std::_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Vector_base
              ((_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)&local_98);
  }
  ppVar2 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)drag_start_parameters.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar5 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
  ppVar6 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)drag_start_parameters.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)drag_start_parameters.m_container.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = ppVar5;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  drag_start_parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
  ::std::_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Vector_base
            ((_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> *)&drag_start_parameters
            );
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_drag_parameters.m_container);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_parameters.m_container);
  return;
}

Assistant:

void Context::UpdateHoverChain(Vector2i old_mouse_position, int key_modifier_state, Dictionary* out_parameters, Dictionary* out_drag_parameters)
{
	const Vector2f position(mouse_position);

	Dictionary local_parameters, local_drag_parameters;
	Dictionary& parameters = out_parameters ? *out_parameters : local_parameters;
	Dictionary& drag_parameters = out_drag_parameters ? *out_drag_parameters : local_drag_parameters;

	// Generate the parameters for the mouse events (there could be a few!).
	GenerateMouseEventParameters(parameters);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	GenerateMouseEventParameters(drag_parameters);
	GenerateDragEventParameters(drag_parameters);
	GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

	// Send out drag events.
	if (drag)
	{
		if (mouse_position != old_mouse_position)
		{
			if (!drag_started)
			{
				Dictionary drag_start_parameters = drag_parameters;
				drag_start_parameters["mouse_x"] = old_mouse_position.x;
				drag_start_parameters["mouse_y"] = old_mouse_position.y;
				drag->DispatchEvent(EventId::Dragstart, drag_start_parameters);
				drag_started = true;

				if (drag->GetComputedValues().drag() == Style::Drag::Clone)
				{
					// Clone the element and attach it to the mouse cursor.
					CreateDragClone(drag);
				}
			}

			drag->DispatchEvent(EventId::Drag, drag_parameters);
		}
	}

	hover = mouse_active ? GetElementAtPoint(position) : nullptr;

	if (enable_cursor)
	{
		String new_cursor_name;

		if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
			new_cursor_name = scroll_controller->GetAutoscrollCursor(mouse_position, density_independent_pixel_ratio);
		else if (drag)
			new_cursor_name = drag->GetComputedValues().cursor();
		else if (hover)
			new_cursor_name = hover->GetComputedValues().cursor();

		if (new_cursor_name != cursor_name)
		{
			GetSystemInterface()->SetMouseCursor(new_cursor_name);
			cursor_name = new_cursor_name;
		}
	}

	// Build the new hover chain.
	ElementSet new_hover_chain;
	Element* element = hover;
	while (element != nullptr)
	{
		new_hover_chain.insert(element);
		element = element->GetParentNode();
	}

	// Send mouseout / mouseover events.
	SendEvents(hover_chain, new_hover_chain, EventId::Mouseout, parameters);
	SendEvents(new_hover_chain, hover_chain, EventId::Mouseover, parameters);

	// Send out drag events.
	if (drag && mouse_active)
	{
		drag_hover = GetElementAtPoint(position, drag);

		ElementSet new_drag_hover_chain;
		element = drag_hover;
		while (element != nullptr)
		{
			new_drag_hover_chain.insert(element);
			element = element->GetParentNode();
		}

		if (drag_started && drag_verbose)
		{
			// Send out ondragover and ondragout events as appropriate.
			SendEvents(drag_hover_chain, new_drag_hover_chain, EventId::Dragout, drag_parameters);
			SendEvents(new_drag_hover_chain, drag_hover_chain, EventId::Dragover, drag_parameters);
		}

		drag_hover_chain.swap(new_drag_hover_chain);
	}

	// Swap the new chain in.
	hover_chain.swap(new_hover_chain);
}